

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  ContextState *pCVar4;
  long lVar5;
  long lVar6;
  pointer ppIVar7;
  IReporter **curr_rep;
  char *__s;
  allocator<char> local_69;
  char *local_68 [4];
  String local_48;
  undefined1 local_30;
  
  __s = "<unknown signal>";
  lVar5 = 0;
  do {
    lVar6 = lVar5;
    if (lVar6 + 0x10 == 0x70) goto LAB_001128e2;
    lVar5 = lVar6 + 0x10;
  } while (*(int *)((long)&(anonymous_namespace)::signalDefs + lVar6) != sig);
  __s = *(char **)((long)&PTR_anon_var_dwarf_507e9_00140478 + lVar6);
LAB_001128e2:
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_69);
  pCVar4 = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar2 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (pCVar4->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1
      ) {
    pIVar3 = *ppIVar7;
    String::String(&local_48,local_68[0]);
    local_30 = 1;
    (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_48);
    String::~String(&local_48);
  }
  while ((detail::g_cs->subcasesStack).
         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         (detail::g_cs->subcasesStack).
         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              (&detail::g_cs->subcasesStack);
    ppIVar2 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                   super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2;
        ppIVar7 = ppIVar7 + 1) {
      (*(*ppIVar7)->_vptr_IReporter[8])();
    }
  }
  detail::ContextState::finalizeTestCaseData(detail::g_cs);
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1
      ) {
    (*(*ppIVar7)->_vptr_IReporter[5])(*ppIVar7,&detail::g_cs->super_CurrentTestCaseStats);
  }
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1
      ) {
    (*(*ppIVar7)->_vptr_IReporter[2])(*ppIVar7,&detail::g_cs->super_TestRunStats);
  }
  std::__cxx11::string::~string((string *)local_68);
  raise(sig);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }